

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O0

bool __thiscall TGAImage::flip_vertically(TGAImage *this)

{
  int iVar1;
  ulong __n;
  void *__dest;
  long lVar2;
  unsigned_long l2;
  unsigned_long l1;
  int j;
  int half;
  uchar *line;
  unsigned_long bytes_per_line;
  TGAImage *this_local;
  
  if (this->data == (uchar *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    __n = (ulong)(this->width * this->bytespp);
    __dest = operator_new__(__n);
    iVar1 = this->height;
    for (l1._0_4_ = 0; (int)l1 < iVar1 >> 1; l1._0_4_ = (int)l1 + 1) {
      lVar2 = (long)((this->height + -1) - (int)l1) * __n;
      memmove(__dest,this->data + (long)(int)l1 * __n,__n);
      memmove(this->data + (long)(int)l1 * __n,this->data + lVar2,__n);
      memmove(this->data + lVar2,__dest,__n);
    }
    if (__dest != (void *)0x0) {
      operator_delete__(__dest);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool TGAImage::flip_vertically() {
    if (!data) return false;
    unsigned long bytes_per_line = width*bytespp;
    unsigned char *line = new unsigned char[bytes_per_line];
    int half = height>>1;
    for (int j=0; j<half; j++) {
        unsigned long l1 = j*bytes_per_line;
        unsigned long l2 = (height-1-j)*bytes_per_line;
        memmove((void *)line,      (void *)(data+l1), bytes_per_line);
        memmove((void *)(data+l1), (void *)(data+l2), bytes_per_line);
        memmove((void *)(data+l2), (void *)line,      bytes_per_line);
    }
    delete [] line;
    return true;
}